

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::convert_to_string_abi_cxx11_
          (string *__return_storage_ptr__,diligent_spirv_cross *this,float t,char locale_radix_point
          )

{
  char *pcVar1;
  undefined7 in_register_00000011;
  allocator local_59;
  char local_58 [8];
  char buf [64];
  char locale_radix_point_local;
  float t_local;
  
  buf[0x3b] = (char)this;
  buf._60_4_ = t;
  sprintf(local_58,"%.32g",(double)t,CONCAT71(in_register_00000011,locale_radix_point));
  fixup_radix_point(local_58,buf[0x3b]);
  pcVar1 = strchr(local_58,0x2e);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strchr(local_58,0x65);
    if (pcVar1 == (char *)0x0) {
      strcat(local_58,".0");
    }
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,local_58,&local_59);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return __return_storage_ptr__;
}

Assistant:

inline std::string convert_to_string(float t, char locale_radix_point)
{
	// std::to_string for floating point values is broken.
	// Fallback to something more sane.
	char buf[64];
	sprintf(buf, SPIRV_CROSS_FLT_FMT, t);
	fixup_radix_point(buf, locale_radix_point);

	// Ensure that the literal is float.
	if (!strchr(buf, '.') && !strchr(buf, 'e'))
		strcat(buf, ".0");
	return buf;
}